

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StorageIntegrationTests.cpp
# Opt level: O3

int testStorageIntegrationTestsReadDataWithIncorrectType(void)

{
  pointer pcVar1;
  string *psVar2;
  uint64_t offset;
  ostream *poVar3;
  pointer ptVar4;
  initializer_list<unsigned_char> __l;
  Span<const_unsigned_char,_18446744073709551615UL> data_00;
  StorageReader reader;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  AutoDeleteTempFile tempfile;
  StorageReader local_90;
  allocator_type local_81;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_80;
  string local_68;
  AutoDeleteTempFile local_48;
  
  MILBlob::TestUtil::AutoDeleteTempFile::AutoDeleteTempFile(&local_48);
  local_90.m_impl._M_t.
  super___uniq_ptr_impl<MILBlob::Blob::StorageReader::Impl,_std::default_delete<MILBlob::Blob::StorageReader::Impl>_>
  ._M_t.
  super__Tuple_impl<0UL,_MILBlob::Blob::StorageReader::Impl_*,_std::default_delete<MILBlob::Blob::StorageReader::Impl>_>
  .super__Head_base<0UL,_MILBlob::Blob::StorageReader::Impl_*,_false>._M_head_impl._0_4_ = 0x400002;
  local_90.m_impl._M_t.
  super___uniq_ptr_impl<MILBlob::Blob::StorageReader::Impl,_std::default_delete<MILBlob::Blob::StorageReader::Impl>_>
  ._M_t.
  super__Tuple_impl<0UL,_MILBlob::Blob::StorageReader::Impl_*,_std::default_delete<MILBlob::Blob::StorageReader::Impl>_>
  .super__Head_base<0UL,_MILBlob::Blob::StorageReader::Impl_*,_false>._M_head_impl._4_1_ = 7;
  __l._M_len = 5;
  __l._M_array = (iterator)&local_90;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_80,__l,&local_81);
  psVar2 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_(&local_48);
  MILBlob::Blob::StorageWriter::StorageWriter((StorageWriter *)&local_90,psVar2,true);
  data_00.m_size.m_size =
       (long)local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  ptVar4 = (pointer)0x0;
  if (data_00.m_size.m_size != 0) {
    ptVar4 = local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  data_00.m_ptr = ptVar4;
  offset = MILBlob::Blob::StorageWriter::WriteData<unsigned_char>
                     ((StorageWriter *)&local_90,data_00);
  MILBlob::Blob::StorageWriter::~StorageWriter((StorageWriter *)&local_90);
  psVar2 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_(&local_48);
  pcVar1 = (psVar2->_M_dataplus)._M_p;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar1,pcVar1 + psVar2->_M_string_length);
  MILBlob::Blob::StorageReader::StorageReader(&local_90,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  MILBlob::Blob::StorageReader::GetDataView<float>(&local_90,offset);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,
             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageIntegrationTests.cpp"
             ,0x7f);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,":",1);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::clog,0x54);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,": expected exception, but none thrown.\n",0x27);
  MILBlob::Blob::StorageReader::~StorageReader(&local_90);
  if (local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  MILBlob::TestUtil::AutoDeleteTempFile::~AutoDeleteTempFile(&local_48);
  return 1;
}

Assistant:

int testStorageIntegrationTestsReadDataWithIncorrectType()
{
    AutoDeleteTempFile tempfile;

    const std::vector<uint8_t> data = {0x02, 0x00, 0x40, 0x00, 0x07};
    uint64_t offset;
    {
        StorageWriter writer(tempfile.GetFilename());
        offset = writer.WriteData(Util::MakeSpan(data));
    }

    StorageReader reader(tempfile.GetFilename());
    {
        ML_ASSERT_THROWS_WITH_MESSAGE(reader.GetDataView<float>(offset),
                                      std::runtime_error,
                                      "Metadata data type does not match requested type.");
    }

    return 0;
}